

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1adff5::FloatExpr<long_double>::printLeft
          (FloatExpr<long_double> *this,OutputStream *s)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char cVar6;
  size_t N;
  anon_union_16_2_325080ff anon_var_0;
  char num [40];
  char local_49;
  char local_48 [16];
  char local_38 [40];
  
  pcVar4 = (this->Contents).First;
  if ((char *)0x14 < (this->Contents).Last + (1 - (long)pcVar4)) {
    lVar5 = 1;
    pcVar1 = &local_49;
    do {
      pcVar3 = pcVar1;
      cVar6 = -0x57;
      if ((int)pcVar4[lVar5] - 0x30U < 10) {
        cVar6 = -0x30;
      }
      pcVar3[1] = ((9 < (int)pcVar4[lVar5 + -1] - 0x30U) * '\t' + pcVar4[lVar5 + -1]) * '\x10' +
                  cVar6 + pcVar4[lVar5];
      lVar5 = lVar5 + 2;
      pcVar1 = pcVar3 + 1;
    } while (lVar5 != 0x15);
    pcVar4 = local_48;
    if (pcVar4 < pcVar3 + 1) {
      lVar5 = -1;
      do {
        cVar6 = *pcVar4;
        *pcVar4 = pcVar3[lVar5 + 2];
        pcVar3[lVar5 + 2] = cVar6;
        lVar5 = lVar5 + -1;
        pcVar4 = pcVar4 + 1;
      } while (lVar5 != -6);
    }
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[0x18] = '\0';
    local_38[0x19] = '\0';
    local_38[0x1a] = '\0';
    local_38[0x1b] = '\0';
    local_38[0x1c] = '\0';
    local_38[0x1d] = '\0';
    local_38[0x1e] = '\0';
    local_38[0x1f] = '\0';
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x20] = '\0';
    local_38[0x21] = '\0';
    local_38[0x22] = '\0';
    local_38[0x23] = '\0';
    local_38[0x24] = '\0';
    local_38[0x25] = '\0';
    local_38[0x26] = '\0';
    local_38[0x27] = '\0';
    iVar2 = snprintf(local_38,0x28,"%LaL");
    if (iVar2 != 0) {
      N = (size_t)iVar2;
      OutputStream::grow(s,N);
      memcpy(s->Buffer + s->CurrentPosition,local_38,N);
      s->CurrentPosition = s->CurrentPosition + N;
    }
  }
  return;
}

Assistant:

const char *end() const { return Last; }